

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ccb0f7::ResizeRealtimeTest_TestExternalResizeWorks4Threads_Test::TestBody
          (ResizeRealtimeTest_TestExternalResizeWorks4Threads_Test *this)

{
  bool bVar1;
  ResizeRealtimeTest *in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  uint expected_h;
  uint expected_w;
  uint frame;
  FrameInfo *info;
  iterator __end1;
  iterator __begin1;
  vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  *__range1;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  ResizingVideoSource video;
  vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  *in_stack_fffffffffffffe68;
  HasNewFatalFailureHelper *in_stack_fffffffffffffe70;
  uint *in_stack_fffffffffffffe78;
  ResizingVideoSource *in_stack_fffffffffffffe80;
  Message *in_stack_fffffffffffffe88;
  int line;
  Message *in_stack_fffffffffffffe90;
  Message *in_stack_fffffffffffffe98;
  Type type;
  HasNewFatalFailureHelper *in_stack_fffffffffffffea0;
  Message *in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  AssertionResult local_108 [2];
  AssertionResult local_e8 [2];
  AssertionResult local_c8;
  undefined1 local_b4 [8];
  uint local_ac;
  reference local_a8;
  FrameInfo *local_a0;
  __normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
  local_98;
  vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  *local_90;
  int local_74;
  HasNewFatalFailureHelper local_70;
  undefined1 local_48 [44];
  int local_1c;
  byte local_17;
  
  ResizingVideoSource::ResizingVideoSource
            (in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
             (int)in_stack_fffffffffffffe78);
  local_1c = 1;
  local_17 = 1;
  in_RDI->change_bitrate_ = false;
  in_RDI->set_scale_mode_ = false;
  in_RDI->set_scale_mode2_ = false;
  in_RDI->set_scale_mode3_ = false;
  in_RDI->mismatch_psnr_ = 0.0;
  in_RDI->mismatch_nframes_ = 0;
  ResizeRealtimeTest::DefaultConfig(in_RDI);
  (in_RDI->super_EncoderTest).cfg_.g_forced_max_frame_width = 0x280;
  (in_RDI->super_EncoderTest).cfg_.g_forced_max_frame_height = 0x1e0;
  (in_RDI->super_EncoderTest).cfg_.g_threads = 4;
  (in_RDI->super_EncoderTest).cfg_.kf_max_dist = 0x28;
  (in_RDI->super_EncoderTest).cfg_.kf_min_dist = 0x28;
  (in_RDI->super_EncoderTest).cfg_.rc_dropframe_thresh = 0;
  bVar1 = testing::internal::AlwaysTrue();
  type = (Type)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_fffffffffffffea0)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(in_RDI->super_EncoderTest)._vptr_EncoderTest[2])(&in_RDI->super_EncoderTest,local_48);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_70);
    if (bVar1) {
      local_74 = 2;
    }
    else {
      local_74 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (in_stack_fffffffffffffe70);
    type = (Type)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    if (local_74 == 0) {
      local_90 = &in_RDI->frame_info_list_;
      local_98._M_current =
           (FrameInfo *)
           std::
           vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
           ::begin(in_stack_fffffffffffffe68);
      local_a0 = (FrameInfo *)
                 std::
                 vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                 ::end(in_stack_fffffffffffffe68);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
                                 *)in_stack_fffffffffffffe70,
                                (__normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
                                 *)in_stack_fffffffffffffe68), bVar1) {
        local_a8 = __gnu_cxx::
                   __normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
                   ::operator*(&local_98);
        local_ac = (uint)local_a8->pts;
        in_stack_fffffffffffffe70 = (HasNewFatalFailureHelper *)local_b4;
        in_stack_fffffffffffffe68 =
             (vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
              *)(local_b4 + 4);
        ScaleForFrameNumber(local_ac,0x280,0x1e0,local_1c,false,(bool)(local_17 & 1),
                            (uint *)in_stack_fffffffffffffe68,(uint *)in_stack_fffffffffffffe70);
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  ((char *)in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80,
                   in_stack_fffffffffffffe78,(uint *)in_stack_fffffffffffffe70);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffea0);
          testing::Message::operator<<
                    ((Message *)in_stack_fffffffffffffe70,(char (*) [7])in_stack_fffffffffffffe68);
          testing::Message::operator<<
                    ((Message *)in_stack_fffffffffffffe70,(uint *)in_stack_fffffffffffffe68);
          testing::Message::operator<<
                    ((Message *)in_stack_fffffffffffffe70,(char (*) [22])in_stack_fffffffffffffe68);
          in_stack_fffffffffffffea0 =
               (HasNewFatalFailureHelper *)
               testing::AssertionResult::failure_message((AssertionResult *)0x8e0a2e);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffea0,
                     (Type)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                     (char *)in_stack_fffffffffffffe90,
                     (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                     (char *)in_stack_fffffffffffffe80);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffee8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
          testing::Message::~Message((Message *)0x8e0a88);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x8e0af6);
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  ((char *)in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80,
                   in_stack_fffffffffffffe78,(uint *)in_stack_fffffffffffffe70);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffea0);
          in_stack_fffffffffffffe98 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffe70,
                          (char (*) [7])in_stack_fffffffffffffe68);
          in_stack_fffffffffffffe90 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffe70,(uint *)in_stack_fffffffffffffe68);
          in_stack_fffffffffffffe88 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffe70,
                          (char (*) [23])in_stack_fffffffffffffe68);
          in_stack_fffffffffffffe80 =
               (ResizingVideoSource *)
               testing::AssertionResult::failure_message((AssertionResult *)0x8e0bb9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffea0,
                     (Type)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                     (char *)in_stack_fffffffffffffe90,
                     (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                     (char *)in_stack_fffffffffffffe80);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffee8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
          testing::Message::~Message((Message *)0x8e0c13);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x8e0c81);
        in_stack_fffffffffffffef4 = 0;
        in_stack_fffffffffffffef0 = ResizeRealtimeTest::GetMismatchFrames(in_RDI);
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  ((char *)in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80,
                   in_stack_fffffffffffffe78,(uint *)in_stack_fffffffffffffe70);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_108);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffea0);
          in_stack_fffffffffffffe78 =
               (uint *)testing::AssertionResult::failure_message((AssertionResult *)0x8e0d10);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffea0,
                     (Type)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                     (char *)in_stack_fffffffffffffe90,
                     (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                     (char *)in_stack_fffffffffffffe80);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffee8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
          testing::Message::~Message((Message *)0x8e0d64);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x8e0dcc);
        __gnu_cxx::
        __normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
        ::operator++(&local_98);
      }
      local_74 = 0;
      goto LAB_008e0df8;
    }
    if (local_74 != 2) goto LAB_008e0df8;
  }
  line = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  testing::Message::Message((Message *)in_stack_fffffffffffffea0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffea0,type,(char *)in_stack_fffffffffffffe90,line,
             (char *)in_stack_fffffffffffffe80);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffee8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
  testing::Message::~Message((Message *)0x8e085a);
  local_74 = 1;
LAB_008e0df8:
  ResizingVideoSource::~ResizingVideoSource((ResizingVideoSource *)0x8e0e05);
  return;
}

Assistant:

TEST_P(ResizeRealtimeTest, TestExternalResizeWorks4Threads) {
  ResizingVideoSource video(640, 480);
  video.flag_codec_ = true;
  video.random_input_one_half_only_ = true;
  change_bitrate_ = false;
  set_scale_mode_ = false;
  set_scale_mode2_ = false;
  set_scale_mode3_ = false;
  mismatch_psnr_ = 0.0;
  mismatch_nframes_ = 0;
  DefaultConfig();
  cfg_.g_forced_max_frame_width = 640;
  cfg_.g_forced_max_frame_height = 480;
  cfg_.g_threads = 4;
  cfg_.kf_max_dist = 40;
  cfg_.kf_min_dist = 40;
  cfg_.rc_dropframe_thresh = 0;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

  for (const auto &info : frame_info_list_) {
    const unsigned int frame = static_cast<unsigned>(info.pts);
    unsigned int expected_w;
    unsigned int expected_h;
    ScaleForFrameNumber(frame, 640, 480, video.flag_codec_, false,
                        video.random_input_one_half_only_, &expected_w,
                        &expected_h);
    EXPECT_EQ(expected_w, info.w)
        << "Frame " << frame << " had unexpected width";
    EXPECT_EQ(expected_h, info.h)
        << "Frame " << frame << " had unexpected height";
    EXPECT_EQ(static_cast<unsigned int>(0), GetMismatchFrames());
  }
}